

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

void client_configure_window_rect
               (xcb_connection_t *connection,xcb_window_t window,xcb_rectangle_t rect,
               uint32_t border_width)

{
  undefined8 in_R8;
  undefined8 in_R9;
  uint local_38;
  uint local_34;
  uint32_t values [5];
  uint16_t mask;
  uint32_t border_width_local;
  xcb_window_t window_local;
  xcb_connection_t *connection_local;
  xcb_rectangle_t rect_local;
  
  values[3]._2_2_ = 0x1f;
  connection_local._0_2_ = rect.x;
  local_38 = (uint)(ushort)connection_local;
  connection_local._2_2_ = rect.y;
  local_34 = (uint)connection_local._2_2_;
  connection_local._4_2_ = rect.width;
  values[0] = (uint32_t)connection_local._4_2_;
  connection_local._6_2_ = rect.height;
  values[1] = (uint32_t)connection_local._6_2_;
  values[2] = border_width;
  values[4] = border_width;
  xcb_configure_window(connection,window,0x1f,&local_38,in_R8,in_R9,0x10720b);
  xcb_flush(connection);
  return;
}

Assistant:

void client_configure_window_rect(xcb_connection_t *connection, xcb_window_t window,
                                  xcb_rectangle_t rect, uint32_t border_width)
{
        uint16_t mask = XCB_CONFIG_WINDOW_X | XCB_CONFIG_WINDOW_Y | XCB_CONFIG_WINDOW_WIDTH
                | XCB_CONFIG_WINDOW_HEIGHT | XCB_CONFIG_WINDOW_BORDER_WIDTH;
        uint32_t values[] = {
                (uint16_t)rect.x,
                (uint16_t)rect.y,
                rect.width,
                rect.height,
                border_width,
        };

        xcb_configure_window(connection, window, mask, values);

        xcb_flush(connection);
}